

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffdtdmll(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,LONGLONG *naxes,
            int *status)

{
  long lVar1;
  double dVar2;
  double doublesize;
  tcolumn *colptr;
  char message [81];
  char *local_58;
  char *lastloc;
  char *loc;
  LONGLONG totalpix;
  LONGLONG dimsize;
  LONGLONG *naxes_local;
  int *naxis_local;
  int maxdim_local;
  int colnum_local;
  char *tdimstr_local;
  fitsfile *fptr_local;
  
  loc = (char *)0x1;
  if (*status < 1) {
    dimsize = (LONGLONG)naxes;
    naxes_local = (LONGLONG *)naxis;
    naxis_local._0_4_ = maxdim;
    naxis_local._4_4_ = colnum;
    _maxdim_local = tdimstr;
    tdimstr_local = (char *)fptr;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((naxis_local._4_4_ < 1) ||
       (*(int *)(*(long *)(tdimstr_local + 8) + 0x3b0) < naxis_local._4_4_)) {
      *status = 0x12e;
      fptr_local._4_4_ = 0x12e;
    }
    else {
      lVar1 = *(long *)(*(long *)(tdimstr_local + 8) + 0x3d0) +
              (long)(naxis_local._4_4_ + -1) * 0xa0;
      if (*_maxdim_local == '\0') {
        *(undefined4 *)naxes_local = 1;
        if (0 < (int)naxis_local) {
          *(undefined8 *)dimsize = *(undefined8 *)(lVar1 + 0x58);
        }
      }
      else {
        *(undefined4 *)naxes_local = 0;
        lastloc = strchr(_maxdim_local,0x28);
        if (lastloc == (char *)0x0) {
          snprintf((char *)&colptr,0x51,"Illegal TDIM keyword value: %s",_maxdim_local);
          *status = 0x107;
          return 0x107;
        }
        for (; lastloc != (char *)0x0; lastloc = strchr(lastloc,0x2c)) {
          lastloc = lastloc + 1;
          dVar2 = strtod(lastloc,&lastloc);
          totalpix = (LONGLONG)(dVar2 + 0.1);
          if ((int)*naxes_local < (int)naxis_local) {
            *(LONGLONG *)(dimsize + (long)(int)*naxes_local * 8) = totalpix;
          }
          if (totalpix < 0) {
            ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
            ffpmsg(_maxdim_local);
            *status = 0x107;
            return 0x107;
          }
          loc = (char *)(totalpix * (long)loc);
          *(int *)naxes_local = (int)*naxes_local + 1;
          local_58 = lastloc;
        }
        lastloc = strchr(local_58,0x29);
        if (lastloc == (char *)0x0) {
          snprintf((char *)&colptr,0x51,"Illegal TDIM keyword value: %s",_maxdim_local);
          *status = 0x107;
          return 0x107;
        }
        if ((0 < *(int *)(lVar1 + 0x50)) && (*(char **)(lVar1 + 0x58) != loc)) {
          snprintf((char *)&colptr,0x51,
                   "column vector length, %.0f, does not equal TDIMn array size, %.0f",
                   (double)*(long *)(lVar1 + 0x58),(double)(long)loc);
          ffpmsg((char *)&colptr);
          ffpmsg(_maxdim_local);
          *status = 0x107;
          return 0x107;
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffdtdmll(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
*/
{
    LONGLONG dimsize;
    LONGLONG totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr;
    double doublesize;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
    {
        *naxis = 1;                   /* default = 1 dimensional */
        if (maxdim > 0)
            naxes[0] = colptr->trepeat; /* default length = repeat */
    }
    else
    {
        *naxis = 0;

        loc = strchr(tdimstr, '(' );  /* find the opening quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        while (loc)
        {
            loc++;

    /* Read value as a double because the string to 64-bit int function is  */
    /* platform dependent (strtoll, strtol, _atoI64).  This still gives     */
    /* about 48 bits of precision, which is plenty for this purpose.        */

            doublesize = strtod(loc, &loc);
            dimsize = (LONGLONG) (doublesize + 0.1);

            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
        }

        loc = strchr(lastloc, ')' );  /* check for the closing quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        if ((colptr->tdatatype > 0) && (colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %.0f, does not equal TDIMn array size, %.0f",
          (double) (colptr->trepeat), (double) totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}